

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall
OpenMD::FragmentStamp::addCutoffGroupStamp(FragmentStamp *this,CutoffGroupStamp *cutoffgroup)

{
  value_type *in_RDI;
  vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool FragmentStamp::addCutoffGroupStamp(CutoffGroupStamp* cutoffgroup) {
    cutoffGroupStamps_.push_back(cutoffgroup);
    return true;
  }